

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int fits_is_this_a_copy(char *urltype)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strncmp(urltype,"mem",3);
  uVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = strncmp(urltype,"compress",8);
    if (iVar1 != 0) {
      iVar1 = strncmp(urltype,"http",4);
      if (iVar1 != 0) {
        iVar1 = strncmp(urltype,"ftp",3);
        if (iVar1 != 0) {
          iVar1 = strncmp(urltype,"gsiftp",6);
          if (iVar1 != 0) {
            builtin_strncpy(urltype,"stdin",5);
            uVar2 = (uint)(urltype == (char *)0x0);
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int fits_is_this_a_copy(char *urltype) /* I - type of file */
/*
  specialized routine that returns 1 if the file is known to be a temporary
  copy of the originally opened file.  Otherwise it returns 0.
*/
{
  int iscopy;

  if (!strncmp(urltype, "mem", 3) )
     iscopy = 1;    /* file copy is in memory */
  else if (!strncmp(urltype, "compress", 8) )
     iscopy = 1;    /* compressed diskfile that is uncompressed in memory */
  else if (!strncmp(urltype, "http", 4) )
     iscopy = 1;    /* copied file using http protocol */
  else if (!strncmp(urltype, "ftp", 3) )
     iscopy = 1;    /* copied file using ftp protocol */
  else if (!strncmp(urltype, "gsiftp", 6) )
     iscopy = 1;    /* copied file using gsiftp protocol */
  else if (!strncpy(urltype, "stdin", 5) )
     iscopy = 1;    /* piped stdin has been copied to memory */
  else
     iscopy = 0;    /* file is not known to be a copy */
 
    return(iscopy);
}